

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O2

void __thiscall PrintC::opPtrsub(PrintC *this,PcodeOp *op)

{
  type_metatype tVar1;
  Varnode *this_00;
  TypeSpacebase *this_01;
  _func_int **pp_Var2;
  bool bVar3;
  bool bVar4;
  HighVariable *this_02;
  Datatype *pDVar5;
  TypeField *pTVar6;
  Scope *this_03;
  SymbolEntry *pSVar7;
  ostream *poVar8;
  LowlevelError *pLVar9;
  uint uVar10;
  ulong uVar11;
  uint m;
  string fieldname;
  int4 newoff;
  string local_1c8 [32];
  ostringstream s;
  
  this_00 = *(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  this_02 = Varnode::getHigh(this_00);
  pDVar5 = HighVariable::getType(this_02);
  if (pDVar5->metatype != TYPE_PTR) {
    (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x13])(this);
    pLVar9 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string
              ((string *)&s,"PTRSUB off of non-pointer type",(allocator *)&fieldname);
    LowlevelError::LowlevelError(pLVar9,(string *)&s);
    __cxa_throw(pLVar9,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  this_01 = (TypeSpacebase *)pDVar5[1]._vptr_Datatype;
  if (((~this_00->flags & 0x50) != 0) ||
     (bVar4 = true, this_00->def->opcode->opcode - CPUI_SEGMENTOP < 0xfffffffe)) {
    bVar4 = false;
  }
  uVar10 = (this->super_PrintLanguage).mods;
  tVar1 = (this_01->super_Datatype).metatype;
  if (tVar1 == TYPE_SPACEBASE) {
    this_03 = TypeSpacebase::getMap(this_01);
    TypeSpacebase::getAddress
              ((TypeSpacebase *)&fieldname,(uintb)this_01,
               (int4)((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                      .super__Vector_impl_data._M_start[1]->loc).offset,
               (Address *)(ulong)(uint)this_00->size);
    if (fieldname._M_dataplus._M_p == (pointer)0x0) {
      pLVar9 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&s,"Unable to generate proper address from spacebase",
                 (allocator *)local_1c8);
      LowlevelError::LowlevelError(pLVar9,(string *)&s);
      __cxa_throw(pLVar9,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
    _s = (AddrSpace *)0x0;
    pSVar7 = Scope::queryContainer(this_03,(Address *)&fieldname,1,(Address *)&s);
    if (pSVar7 == (SymbolEntry *)0x0) {
      if ((uVar10 & 0x60) != 0) goto LAB_003277b1;
LAB_00327768:
      PrintLanguage::pushOp(&this->super_PrintLanguage,&addressof,op);
      if (pSVar7 == (SymbolEntry *)0x0) {
LAB_003277b1:
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[6])(this,&fieldname,0,op);
        return;
      }
    }
    else {
      tVar1 = pSVar7->symbol->type->metatype;
      if (tVar1 == TYPE_ARRAY) {
        if ((uVar10 & 0x60) != 0) {
          PrintLanguage::pushOp(&this->super_PrintLanguage,&subscript,op);
          bVar4 = true;
          goto LAB_00327781;
        }
      }
      else if (tVar1 != TYPE_CODE && (uVar10 & 0x60) == 0) goto LAB_00327768;
    }
    bVar4 = false;
LAB_00327781:
    pp_Var2 = (this->super_PrintLanguage)._vptr_PrintLanguage;
    uVar10 = ((int)fieldname._M_string_length - (int)(pSVar7->addr).offset) + pSVar7->offset;
    if (uVar10 == 0) {
      (*pp_Var2[5])(this,pSVar7->symbol,0,op);
    }
    else {
      (*pp_Var2[7])(this,pSVar7->symbol,(ulong)uVar10,0,0,op,0);
    }
    if (!bVar4) {
      return;
    }
    (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x72])(this,0,4,0,0,op);
    return;
  }
  m = uVar10 & 0xffffff9f;
  if (tVar1 == TYPE_ARRAY) {
    if (((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
         super__Vector_impl_data._M_start[1]->loc).offset != 0) {
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x13])(this);
      pLVar9 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&s,"PTRSUB with non-zero offset into array type",(allocator *)&fieldname)
      ;
      LowlevelError::LowlevelError(pLVar9,(string *)&s);
      __cxa_throw(pLVar9,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
    if ((uVar10 & 0x60) != 0) {
      PrintLanguage::pushOp(&this->super_PrintLanguage,&subscript,op);
      if (!bVar4) {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&dereference,op);
      }
      PrintLanguage::pushVnImplied(&this->super_PrintLanguage,this_00,op,m);
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x72])(this,0,4,0,0,op);
      return;
    }
    if (!bVar4) {
      PrintLanguage::pushOp(&this->super_PrintLanguage,&dereference,op);
    }
    PrintLanguage::pushVnImplied(&this->super_PrintLanguage,this_00,op,m);
    return;
  }
  if (tVar1 != TYPE_STRUCT) {
    (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x13])(this);
    pLVar9 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string
              ((string *)&s,"PTRSUB off of non structured pointer type",(allocator *)&fieldname);
    LowlevelError::LowlevelError(pLVar9,(string *)&s);
    __cxa_throw(pLVar9,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  uVar11 = (ulong)(uint)pDVar5[1].size *
           ((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start[1]->loc).offset;
  fieldname._M_dataplus._M_p = (pointer)&fieldname.field_2;
  fieldname._M_string_length = 0;
  fieldname.field_2._M_local_buf[0] = '\0';
  pTVar6 = TypeStruct::getField((TypeStruct *)this_01,(int4)uVar11,0,&newoff);
  if (pTVar6 == (TypeField *)0x0) {
    if ((ulong)(long)(this_01->super_Datatype).size <= uVar11) {
      pLVar9 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&s,"PTRSUB out of bounds into struct",(allocator *)local_1c8);
      LowlevelError::LowlevelError(pLVar9,(string *)&s);
      __cxa_throw(pLVar9,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    poVar8 = std::operator<<((ostream *)&s,"field_0x");
    *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
         *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&fieldname,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
LAB_00327671:
    if ((uVar10 & 0x60) == 0) {
LAB_003276df:
      if (bVar4) {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&addressof,op);
        PrintLanguage::pushOp(&this->super_PrintLanguage,&object_member,op);
        PrintLanguage::pushVnImplied(&this->super_PrintLanguage,this_00,op,m | 0x20);
        _s = &fieldname;
        PrintLanguage::pushAtom(&this->super_PrintLanguage,(Atom *)&s);
      }
      else {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&addressof,op);
        PrintLanguage::pushOp(&this->super_PrintLanguage,&pointer_member,op);
        PrintLanguage::pushVnImplied(&this->super_PrintLanguage,this_00,op,m);
        _s = &fieldname;
        PrintLanguage::pushAtom(&this->super_PrintLanguage,(Atom *)&s);
      }
      goto LAB_003278d7;
    }
LAB_00327677:
    bVar3 = false;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&fieldname);
    if (pTVar6->type == (Datatype *)0x0) goto LAB_00327671;
    tVar1 = pTVar6->type->metatype;
    if (tVar1 != TYPE_ARRAY && (uVar10 & 0x60) == 0) goto LAB_003276df;
    if ((uVar10 & 0x60) == 0 || tVar1 != TYPE_ARRAY) goto LAB_00327677;
    bVar3 = true;
    PrintLanguage::pushOp(&this->super_PrintLanguage,&subscript,op);
  }
  if (bVar4) {
    PrintLanguage::pushOp(&this->super_PrintLanguage,&object_member,op);
    PrintLanguage::pushVnImplied(&this->super_PrintLanguage,this_00,op,m | 0x20);
    _s = &fieldname;
    PrintLanguage::pushAtom(&this->super_PrintLanguage,(Atom *)&s);
  }
  else {
    PrintLanguage::pushOp(&this->super_PrintLanguage,&pointer_member,op);
    PrintLanguage::pushVnImplied(&this->super_PrintLanguage,this_00,op,m);
    _s = &fieldname;
    PrintLanguage::pushAtom(&this->super_PrintLanguage,(Atom *)&s);
  }
  if (bVar3) {
    (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x72])(this,0,4,0,0,op);
  }
LAB_003278d7:
  std::__cxx11::string::~string((string *)&fieldname);
  return;
}

Assistant:

void PrintC::opPtrsub(const PcodeOp *op)

{
  TypePointer *ptype;
  Datatype *ct;
  const Varnode *in0;
  bool valueon,flex,arrayvalue;
  uint4 m;

  in0 = op->getIn(0);
  ptype = (TypePointer *)in0->getHigh()->getType();
  if (ptype->getMetatype() != TYPE_PTR) {
    clear();
    throw LowlevelError("PTRSUB off of non-pointer type");
  }
  ct = ptype->getPtrTo();
  m = mods & ~(print_load_value|print_store_value); // Current state of mods
  valueon = (mods & (print_load_value|print_store_value)) != 0;
  flex = isValueFlexible(in0);

  if (ct->getMetatype() == TYPE_STRUCT) {
    uintb suboff = op->getIn(1)->getOffset();	// How far into container
    suboff = AddrSpace::addressToByte(suboff,ptype->getWordSize());
    string fieldname;
    Datatype *fieldtype;
    int4 fieldoffset;
    int4 newoff;
    const TypeField *fld = ((TypeStruct *)ct)->getField((int4)suboff,0,&newoff);
    if (fld == (const TypeField *)0) {
      if (ct->getSize() <= suboff)
	throw LowlevelError("PTRSUB out of bounds into struct");
      // Try to match the Ghidra's default field name from DataTypeComponent.getDefaultFieldName
      ostringstream s;
      s << "field_0x" << hex << suboff;
      fieldname = s.str();
      fieldtype = (Datatype *)0;
      fieldoffset = suboff;
    }
    else {
      fieldname = fld->name;
      fieldtype = fld->type;
      fieldoffset = fld->offset;
    }
    arrayvalue = false;
    // The '&' is dropped if the output type is an array
    if ((fieldtype != (Datatype *)0)&&(fieldtype->getMetatype()==TYPE_ARRAY)) {
      arrayvalue = valueon;	// If printing value, use [0]
      valueon = true;		// Don't print &
    }
    
    if (!valueon) {		// Printing an ampersand
      if (flex) {		// EMIT  &( ).name
	pushOp(&addressof,op);
	pushOp(&object_member,op);
	pushVnImplied(in0,op,m | print_load_value);
	pushAtom(Atom(fieldname,fieldtoken,EmitXml::no_color,ct,fieldoffset));
      }
      else {			// EMIT  &( )->name
	pushOp(&addressof,op);
	pushOp(&pointer_member,op);
	pushVnImplied(in0,op,m);
	pushAtom(Atom(fieldname,fieldtoken,EmitXml::no_color,ct,fieldoffset));
      }
    }
    else {			// Not printing an ampersand
      if (arrayvalue)
	pushOp(&subscript,op);
      if (flex) {		// EMIT  ( ).name
	pushOp(&object_member,op);
	pushVnImplied(in0,op,m | print_load_value);
	pushAtom(Atom(fieldname,fieldtoken,EmitXml::no_color,ct,fieldoffset));
      }
      else {			// EMIT  ( )->name
	pushOp(&pointer_member,op);
	pushVnImplied(in0,op,m);
	pushAtom(Atom(fieldname,fieldtoken,EmitXml::no_color,ct,fieldoffset));
      }
      if (arrayvalue)
	push_integer(0,4,false,(Varnode *)0,op);
    }
  }
  else if (ct->getMetatype() == TYPE_SPACEBASE) {
    TypeSpacebase *sb = (TypeSpacebase *)ct;
    Scope *scope = sb->getMap();
    Address addr = sb->getAddress(op->getIn(1)->getOffset(),in0->getSize(),op->getAddr());
    if (addr.isInvalid())
      throw LowlevelError("Unable to generate proper address from spacebase");
    SymbolEntry *entry = scope->queryContainer(addr,1,Address());
    Datatype *ct = (Datatype *)0;
    arrayvalue = false;
    if (entry != (SymbolEntry *)0) {
      ct = entry->getSymbol()->getType();
	   // The '&' is dropped if the output type is an array
      if (ct->getMetatype()==TYPE_ARRAY) {
	arrayvalue = valueon;	// If printing value, use [0]
	valueon = true;		// If printing ptr, don't use &
      }
      else if (ct->getMetatype()==TYPE_CODE)
	valueon = true;		// If printing ptr, don't use &
    }
    if (!valueon) {		// EMIT  &name
      pushOp(&addressof,op);
    }
    else {			// EMIT  name
      if (arrayvalue)
	pushOp(&subscript,op);
    }
    if (entry == (SymbolEntry *)0)
      pushUnnamedLocation(addr,(Varnode *)0,op);
    else {
      int4 off = (int4)(addr.getOffset() - entry->getAddr().getOffset()) + entry->getOffset();
      if (off == 0)
	pushSymbol(entry->getSymbol(),(Varnode *)0,op);
      else {
	// If this "value" is getting used as a storage location
	// we can't use a cast in its description, so turn off
	// casting when printing the partial symbol
	//	Datatype *exttype = ((mods & print_store_value)!=0) ? (Datatype *)0 : ct;
	pushPartialSymbol(entry->getSymbol(),off,0,(Varnode *)0,op,(Datatype *)0);
      }
    }
    if (arrayvalue)
      push_integer(0,4,false,(Varnode *)0,op);
  }
  else if (ct->getMetatype() == TYPE_ARRAY) {
    if (op->getIn(1)->getOffset() != 0) {
      clear();
      throw LowlevelError("PTRSUB with non-zero offset into array type");
    }
  // We are treating array as a structure
  // and this PTRSUB(*,0) represents changing
  // to treating it as a pointer to its element type
    if (!valueon) {
      if (flex) {		// EMIT  ( )
				// (*&struct->arrayfield)[i]
				// becomes struct->arrayfield[i]
	pushVnImplied(in0,op,m);
      }
      else {			// EMIT  *( )
	pushOp(&dereference,op);
	pushVnImplied(in0,op,m);
      }
    }
    else {
      if (flex) {		// EMIT  ( )[0]
	pushOp(&subscript,op);
	pushVnImplied(in0,op,m);
	push_integer(0,4,false,(Varnode *)0,op);
      }
      else {			// EMIT  (* )[0]
	pushOp(&subscript,op);
	pushOp(&dereference,op);
	pushVnImplied(in0,op,m);
	push_integer(0,4,false,(Varnode *)0,op);
      }
    }
  }
  else {
    clear();
    throw LowlevelError("PTRSUB off of non structured pointer type");
  }
}